

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

void yang_free_deviate(ly_ctx *ctx,lys_deviation *dev,uint index)

{
  lys_type *type;
  char **__ptr;
  lys_restr *__ptr_00;
  lys_unique *__ptr_01;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  for (uVar1 = (ulong)index; uVar1 < dev->deviate_size; uVar1 = uVar1 + 1) {
    lydict_remove(ctx,dev->deviate[uVar1].units);
    type = dev->deviate[uVar1].type;
    if (type != (lys_type *)0x0) {
      yang_type_free(ctx,type);
    }
    for (uVar3 = 0; __ptr = dev->deviate[uVar1].dflt, uVar3 < dev->deviate[uVar1].dflt_size;
        uVar3 = uVar3 + 1) {
      lydict_remove(ctx,__ptr[uVar3]);
    }
    free(__ptr);
    lVar2 = 0;
    for (uVar3 = 0; __ptr_00 = dev->deviate[uVar1].must, uVar3 < dev->deviate[uVar1].must_size;
        uVar3 = uVar3 + 1) {
      lys_restr_free(ctx,(lys_restr *)((long)&__ptr_00->expr + lVar2));
      lVar2 = lVar2 + 0x38;
    }
    free(__ptr_00);
    lVar2 = 0;
    for (uVar3 = 0; __ptr_01 = dev->deviate[uVar1].unique, uVar3 < dev->deviate[uVar1].unique_size;
        uVar3 = uVar3 + 1) {
      free(*(void **)((long)&__ptr_01->expr + lVar2));
      lVar2 = lVar2 + 0x10;
    }
    free(__ptr_01);
    lys_extension_instances_free(ctx,dev->deviate[uVar1].ext,(uint)dev->deviate[uVar1].ext_size);
  }
  return;
}

Assistant:

static void
yang_free_deviate(struct ly_ctx *ctx, struct lys_deviation *dev, uint index)
{
    uint i, j;

    for (i = index; i < dev->deviate_size; ++i) {
        lydict_remove(ctx, dev->deviate[i].units);

        if (dev->deviate[i].type) {
            yang_type_free(ctx, dev->deviate[i].type);
        }

        for (j = 0; j < dev->deviate[i].dflt_size; ++j) {
            lydict_remove(ctx, dev->deviate[i].dflt[j]);
        }
        free(dev->deviate[i].dflt);

        for (j = 0; j < dev->deviate[i].must_size; ++j) {
            lys_restr_free(ctx, &dev->deviate[i].must[j]);
        }
        free(dev->deviate[i].must);

        for (j = 0; j < dev->deviate[i].unique_size; ++j) {
            free(dev->deviate[i].unique[j].expr);
        }
        free(dev->deviate[i].unique);
        lys_extension_instances_free(ctx, dev->deviate[i].ext, dev->deviate[i].ext_size);
    }
}